

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O1

void __thiscall inja::Lexer::start(Lexer *this,string_view input)

{
  char **ppcVar1;
  ulong uVar2;
  int iVar3;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  local_18._M_str = input._M_str;
  local_18._M_len = input._M_len;
  (this->m_in)._M_len = local_18._M_len;
  (this->m_in)._M_str = local_18._M_str;
  this->state = Text;
  this->minus_state = Number;
  this->tok_start = 0;
  this->pos = 0;
  if (2 < local_18._M_len) {
    __str._M_str = anon_var_dwarf_7c754;
    __str._M_len = 3;
    iVar3 = std::basic_string_view<char,_std::char_traits<char>_>::compare(&local_18,0,3,__str);
    if (iVar3 == 0) {
      uVar2 = (this->m_in)._M_len;
      if (uVar2 < 3) {
        ::std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",3)
        ;
      }
      (this->m_in)._M_len = uVar2 - 3;
      ppcVar1 = &(this->m_in)._M_str;
      *ppcVar1 = *ppcVar1 + 3;
    }
  }
  return;
}

Assistant:

void start(std::string_view input) {
    m_in = input;
    tok_start = 0;
    pos = 0;
    state = State::Text;
    minus_state = MinusState::Number;

    // Consume byte order mark (BOM) for UTF-8
    if (inja::string_view::starts_with(m_in, "\xEF\xBB\xBF")) {
      m_in = m_in.substr(3);
    }
  }